

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

QString * __thiscall QVersionNumber::toString(QString *__return_storage_ptr__,QVersionNumber *this)

{
  byte bVar1;
  bool bVar2;
  int n;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    lVar4 = (((this->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar4 = (long)((char)bVar1 >> 1);
  }
  lVar3 = 1;
  if (1 < lVar4 * 2) {
    lVar3 = lVar4 * 2;
  }
  QString::reserve(__return_storage_ptr__,lVar3 + -1);
  bVar2 = true;
  lVar4 = 0;
  while( true ) {
    bVar1 = (this->m_segments).field_0.inline_segments[0];
    if ((bVar1 & 1) == 0) {
      lVar3 = (((this->m_segments).field_0.pointer_segments)->d).size;
    }
    else {
      lVar3 = (long)((char)bVar1 >> 1);
    }
    if (lVar3 <= lVar4) break;
    if (!bVar2) {
      QString::append(__return_storage_ptr__,(QChar)0x2e);
    }
    n = segmentAt(this,lVar4);
    QString::number((QString *)&local_50,n,10);
    QString::append(__return_storage_ptr__,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    lVar4 = lVar4 + 1;
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QVersionNumber::toString() const
{
    QString version;
    version.reserve(qMax(segmentCount() * 2 - 1, 0));
    bool first = true;
    for (qsizetype i = 0; i < segmentCount(); ++i) {
        if (!first)
            version += u'.';
        version += QString::number(segmentAt(i));
        first = false;
    }
    return version;
}